

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O3

bool __thiscall entityx::EntityManager::has_component<B>(EntityManager *this,Id id)

{
  Family FVar1;
  bool bVar2;
  
  FVar1 = Component<B>::family();
  if ((FVar1 < (ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3)) &&
     (*(long *)(*(long *)(this + 0x18) + FVar1 * 8) != 0)) {
    bVar2 = (*(ulong *)(*(long *)(this + 0x48) + (id.id_ & 0xffffffff) * 8) >> (FVar1 & 0x3f) & 1)
            != 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool has_component(Entity::Id id) const {
    assert_valid(id);
    size_t family = component_family<C>();
    // We don't bother checking the component mask, as we return a nullptr anyway.
    if (family >= component_pools_.size())
      return false;
    BasePool *pool = component_pools_[family];
    if (!pool || !entity_component_mask_[id.index()][family])
      return false;
    return true;
  }